

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O0

void add_file_if_regex_ok(regex *r,list<int,_std::allocator<int>_> *file_list,string *file_name)

{
  exception *e;
  int local_44;
  undefined1 local_40 [4];
  int in_no;
  string in_file;
  string *file_name_local;
  list<int,_std::allocator<int>_> *file_list_local;
  regex *r_local;
  
  in_file.field_2._8_8_ = file_name;
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,file_name
             ,r,"$1",0);
  local_44 = std::__cxx11::stoi((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,(size_t *)0x0,10);
  std::__cxx11::list<int,_std::allocator<int>_>::push_back(file_list,&local_44);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void add_file_if_regex_ok(const regex &r, list<int> &file_list, const string &file_name) {
    string in_file = regex_replace(file_name, r, "$1");

    // NOTE: If the regex did not find anything, the original string is passed on to in_file
    //       -> With stoi, this should be handled with the exception catching
    try {
        int in_no = stoi(in_file);
        file_list.push_back(in_no);
    }
    catch (exception &e) {
        // Do nothing
    }
}